

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::detail::TestCase::TestCase
          (TestCase *this,funcType test,char *file,uint line,TestSuite *test_suite,char *type,
          int template_id)

{
  String local_60;
  char *local_38;
  char *type_local;
  TestSuite *test_suite_local;
  char *pcStack_20;
  uint line_local;
  char *file_local;
  funcType test_local;
  TestCase *this_local;
  
  local_38 = type;
  type_local = (char *)test_suite;
  test_suite_local._4_4_ = line;
  pcStack_20 = file;
  file_local = (char *)test;
  test_local = (funcType)this;
  TestCaseData::TestCaseData(&this->super_TestCaseData);
  String::String(&this->m_full_name);
  String::String(&local_60,pcStack_20);
  String::operator=((String *)this,&local_60);
  String::~String(&local_60);
  (this->super_TestCaseData).m_line = test_suite_local._4_4_;
  (this->super_TestCaseData).m_name = (char *)0x0;
  (this->super_TestCaseData).m_test_suite = *(char **)type_local;
  (this->super_TestCaseData).m_description = *(char **)(type_local + 8);
  (this->super_TestCaseData).m_skip = (bool)(type_local[0x10] & 1);
  (this->super_TestCaseData).m_no_breaks = (bool)(type_local[0x11] & 1);
  (this->super_TestCaseData).m_no_output = (bool)(type_local[0x12] & 1);
  (this->super_TestCaseData).m_may_fail = (bool)(type_local[0x13] & 1);
  (this->super_TestCaseData).m_should_fail = (bool)(type_local[0x14] & 1);
  (this->super_TestCaseData).m_expected_failures = *(int *)(type_local + 0x18);
  (this->super_TestCaseData).m_timeout = *(double *)(type_local + 0x20);
  this->m_test = (funcType)file_local;
  this->m_type = local_38;
  this->m_template_id = template_id;
  return;
}

Assistant:

TestCase::TestCase(funcType test, const char* file, unsigned line, const TestSuite& test_suite,
                       const char* type, int template_id) {
        m_file              = file;
        m_line              = line;
        m_name              = nullptr; // will be later overridden in operator*
        m_test_suite        = test_suite.m_test_suite;
        m_description       = test_suite.m_description;
        m_skip              = test_suite.m_skip;
        m_no_breaks         = test_suite.m_no_breaks;
        m_no_output         = test_suite.m_no_output;
        m_may_fail          = test_suite.m_may_fail;
        m_should_fail       = test_suite.m_should_fail;
        m_expected_failures = test_suite.m_expected_failures;
        m_timeout           = test_suite.m_timeout;

        m_test        = test;
        m_type        = type;
        m_template_id = template_id;
    }